

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::NewFrameUpdateHoveredWindowAndCaptureFlags(void)

{
  float *pfVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  uint uVar6;
  ImGuiContext *pIVar7;
  ulong uVar8;
  ImGuiWindow *pIVar9;
  byte bVar10;
  bool bVar11;
  ImGuiContext *g;
  byte bVar12;
  byte bVar13;
  int iVar14;
  long lVar15;
  bool bVar16;
  ImGuiWindow *pIVar17;
  ImGuiWindow *pIVar18;
  
  pIVar7 = GImGui;
  pIVar17 = GImGui->MovingWindow;
  if ((pIVar17 == (ImGuiWindow *)0x0) || ((pIVar17->Flags & 0x200) != 0)) {
    lVar15 = (long)(GImGui->Windows).Size;
    if (0 < lVar15) {
      uVar8 = lVar15 + 1;
      do {
        pIVar17 = (GImGui->Windows).Data[uVar8 - 2];
        if ((pIVar17->Active == true) && ((pIVar17->Flags & 0x200) == 0)) {
          fVar5 = (GImGui->Style).TouchExtraPadding.x;
          fVar2 = (GImGui->IO).MousePos.x;
          if ((pIVar17->OuterRectClipped).Min.x - fVar5 <= fVar2) {
            fVar3 = (GImGui->Style).TouchExtraPadding.y;
            fVar4 = (GImGui->IO).MousePos.y;
            if ((((pIVar17->OuterRectClipped).Min.y - fVar3 <= fVar4) &&
                (fVar2 < fVar5 + (pIVar17->OuterRectClipped).Max.x)) &&
               (fVar4 < fVar3 + (pIVar17->OuterRectClipped).Max.y)) goto LAB_00176d26;
          }
        }
        uVar8 = uVar8 - 1;
      } while (1 < uVar8);
    }
    GImGui->HoveredWindow = (ImGuiWindow *)0x0;
    pIVar17 = (ImGuiWindow *)0x0;
    pIVar18 = (ImGuiWindow *)0x0;
  }
  else {
LAB_00176d26:
    GImGui->HoveredWindow = pIVar17;
    pIVar18 = pIVar17->RootWindow;
  }
  pIVar7->HoveredRootWindow = pIVar18;
  pIVar9 = GetFrontMostPopupModal();
  if (((pIVar9 != (ImGuiWindow *)0x0) && (pIVar18 != (ImGuiWindow *)0x0)) &&
     (pIVar18->RootWindow != pIVar9)) {
    do {
      if (pIVar18 == pIVar9) goto LAB_00176e21;
      pIVar18 = pIVar18->ParentWindow;
    } while (pIVar18 != (ImGuiWindow *)0x0);
    pIVar7->HoveredWindow = (ImGuiWindow *)0x0;
    pIVar7->HoveredRootWindow = (ImGuiWindow *)0x0;
    pIVar17 = (ImGuiWindow *)0x0;
  }
LAB_00176e21:
  uVar6 = (pIVar7->IO).ConfigFlags;
  if ((uVar6 & 0x10) != 0) {
    pIVar7->HoveredWindow = (ImGuiWindow *)0x0;
    pIVar7->HoveredRootWindow = (ImGuiWindow *)0x0;
    pIVar17 = (ImGuiWindow *)0x0;
  }
  iVar14 = -1;
  lVar15 = 0;
  bVar10 = 0;
  do {
    if ((pIVar7->IO).MouseClicked[lVar15] == true) {
      bVar16 = true;
      if (pIVar17 == (ImGuiWindow *)0x0) {
        bVar16 = (pIVar7->OpenPopupStack).Size != 0;
      }
      (pIVar7->IO).MouseDownOwned[lVar15] = bVar16;
    }
    bVar16 = (pIVar7->IO).MouseDown[lVar15];
    if (bVar16 == true) {
      if (iVar14 != -1) {
        fVar5 = (pIVar7->IO).MouseClickedTime[iVar14];
        pfVar1 = (pIVar7->IO).MouseClickedTime + lVar15;
        if (fVar5 < *pfVar1 || fVar5 == *pfVar1) goto LAB_00176e90;
      }
      iVar14 = (int)lVar15;
    }
LAB_00176e90:
    bVar10 = bVar10 & 1 | bVar16;
    lVar15 = lVar15 + 1;
    if (lVar15 == 5) {
      if (iVar14 == -1) {
        bVar12 = 1;
      }
      else {
        bVar12 = (pIVar7->IO).MouseDownOwned[iVar14];
      }
      if (pIVar7->DragDropActive == true) {
        bVar13 = ((byte)pIVar7->DragDropSourceFlags & 0x10) >> 4;
      }
      else {
        bVar13 = 0;
      }
      if (bVar13 == 0 && (bVar12 & 1) == 0) {
        pIVar7->HoveredWindow = (ImGuiWindow *)0x0;
        pIVar7->HoveredRootWindow = (ImGuiWindow *)0x0;
        pIVar17 = (ImGuiWindow *)0x0;
      }
      if (pIVar7->WantCaptureMouseNextFrame == -1) {
        bVar16 = true;
        if ((bVar12 & (pIVar17 != (ImGuiWindow *)0x0 || bVar10 != 0)) == 0) {
          bVar16 = (pIVar7->OpenPopupStack).Size != 0;
        }
        (pIVar7->IO).WantCaptureMouse = bVar16;
      }
      else {
        (pIVar7->IO).WantCaptureMouse = pIVar7->WantCaptureMouseNextFrame != 0;
      }
      if (pIVar7->WantCaptureKeyboardNextFrame == -1) {
        bVar16 = pIVar7->ActiveId != 0 || pIVar9 != (ImGuiWindow *)0x0;
      }
      else {
        bVar16 = pIVar7->WantCaptureKeyboardNextFrame != 0;
      }
      bVar11 = true;
      if ((pIVar7->IO).NavActive == false) {
        bVar11 = bVar16;
      }
      if ((uVar6 & 9) != 1) {
        bVar11 = bVar16;
      }
      (pIVar7->IO).WantCaptureKeyboard = bVar11;
      (pIVar7->IO).WantTextInput = pIVar7->WantTextInputNextFrame - 1U < 0xfffffffe;
      return;
    }
  } while( true );
}

Assistant:

void ImGui::NewFrameUpdateHoveredWindowAndCaptureFlags()
{
    ImGuiContext& g = *GImGui;

    // Find the window hovered by mouse:
    // - Child windows can extend beyond the limit of their parent so we need to derive HoveredRootWindow from HoveredWindow.
    // - When moving a window we can skip the search, which also conveniently bypasses the fact that window->WindowRectClipped is lagging as this point of the frame.
    // - We also support the moved window toggling the NoInputs flag after moving has started in order to be able to detect windows below it, which is useful for e.g. docking mechanisms.
    g.HoveredWindow = (g.MovingWindow && !(g.MovingWindow->Flags & ImGuiWindowFlags_NoInputs)) ? g.MovingWindow : FindHoveredWindow();
    g.HoveredRootWindow = g.HoveredWindow ? g.HoveredWindow->RootWindow : NULL;

    // Modal windows prevents cursor from hovering behind them.
    ImGuiWindow* modal_window = GetFrontMostPopupModal();
    if (modal_window)
        if (g.HoveredRootWindow && !IsWindowChildOf(g.HoveredRootWindow, modal_window))
            g.HoveredRootWindow = g.HoveredWindow = NULL;

    // Disabled mouse?
    if (g.IO.ConfigFlags & ImGuiConfigFlags_NoMouse)
        g.HoveredWindow = g.HoveredRootWindow = NULL;

    // We track click ownership. When clicked outside of a window the click is owned by the application and won't report hovering nor request capture even while dragging over our windows afterward.
    int mouse_earliest_button_down = -1;
    bool mouse_any_down = false;
    for (int i = 0; i < IM_ARRAYSIZE(g.IO.MouseDown); i++)
    {
        if (g.IO.MouseClicked[i])
            g.IO.MouseDownOwned[i] = (g.HoveredWindow != NULL) || (!g.OpenPopupStack.empty());
        mouse_any_down |= g.IO.MouseDown[i];
        if (g.IO.MouseDown[i])
            if (mouse_earliest_button_down == -1 || g.IO.MouseClickedTime[i] < g.IO.MouseClickedTime[mouse_earliest_button_down])
                mouse_earliest_button_down = i;
    }
    const bool mouse_avail_to_imgui = (mouse_earliest_button_down == -1) || g.IO.MouseDownOwned[mouse_earliest_button_down];

    // If mouse was first clicked outside of ImGui bounds we also cancel out hovering.
    // FIXME: For patterns of drag and drop across OS windows, we may need to rework/remove this test (first committed 311c0ca9 on 2015/02)
    const bool mouse_dragging_extern_payload = g.DragDropActive && (g.DragDropSourceFlags & ImGuiDragDropFlags_SourceExtern) != 0;
    if (!mouse_avail_to_imgui && !mouse_dragging_extern_payload)
        g.HoveredWindow = g.HoveredRootWindow = NULL;

    // Update io.WantCaptureMouse for the user application (true = dispatch mouse info to imgui, false = dispatch mouse info to imgui + app)
    if (g.WantCaptureMouseNextFrame != -1)
        g.IO.WantCaptureMouse = (g.WantCaptureMouseNextFrame != 0);
    else
        g.IO.WantCaptureMouse = (mouse_avail_to_imgui && (g.HoveredWindow != NULL || mouse_any_down)) || (!g.OpenPopupStack.empty());

    // Update io.WantCaptureKeyboard for the user application (true = dispatch keyboard info to imgui, false = dispatch keyboard info to imgui + app)
    if (g.WantCaptureKeyboardNextFrame != -1)
        g.IO.WantCaptureKeyboard = (g.WantCaptureKeyboardNextFrame != 0);
    else
        g.IO.WantCaptureKeyboard = (g.ActiveId != 0) || (modal_window != NULL);
    if (g.IO.NavActive && (g.IO.ConfigFlags & ImGuiConfigFlags_NavEnableKeyboard) && !(g.IO.ConfigFlags & ImGuiConfigFlags_NavNoCaptureKeyboard))
        g.IO.WantCaptureKeyboard = true;

    // Update io.WantTextInput flag, this is to allow systems without a keyboard (e.g. mobile, hand-held) to show a software keyboard if possible
    g.IO.WantTextInput = (g.WantTextInputNextFrame != -1) ? (g.WantTextInputNextFrame != 0) : false;
}